

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool operator_string_add(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  int iVar1;
  int iVar2;
  gravity_object_t *pgVar3;
  uint uVar4;
  char *s;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  gravity_value_t gVar6;
  char buffer [4096];
  char local_1038 [4104];
  
  pgVar3 = (args->field_1).p;
  gVar6 = convert_value2string(vm,args[1]);
  aVar5 = gVar6.field_1;
  if (gVar6.isa == (gravity_class_t *)0x0) {
    builtin_strncpy(local_1038,"Unable to convert object to String",0x23);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1038);
  }
  else {
    iVar1 = *(int *)((long)&pgVar3->identifier + 4);
    iVar2 = *(int *)((long)&(aVar5.p)->identifier + 4);
    uVar4 = iVar2 + iVar1 + 1;
    s = local_1038;
    if ((uVar4 < 0x1000) || (s = (char *)gravity_calloc(vm,1,(ulong)uVar4), s != (char *)0x0)) {
      memcpy(s,pgVar3->objclass,(ulong)*(uint *)((long)&pgVar3->identifier + 4));
      memcpy(s + *(uint *)((long)&pgVar3->identifier + 4),(aVar5.p)->objclass,
             (ulong)*(uint *)((long)&(aVar5.p)->identifier + 4));
      gVar6 = gravity_string_to_value(vm,s,iVar2 + iVar1);
      if (s != local_1038) {
        free(s);
      }
      gravity_vm_setslot(vm,gVar6,rindex);
      return true;
    }
  }
  gVar6.field_1.n = 0;
  gVar6.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar6,rindex);
  return false;
}

Assistant:

static bool operator_string_add (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    gravity_string_t *s2 = VALUE_AS_STRING(v2);

    uint32_t len = s1->len + s2->len;
    char buffer[4096];
    char *s = NULL;

    // check if I can save an allocation
    if (len+1 < sizeof(buffer)) s = buffer;
    else {
        s = mem_alloc(vm, len+1);
        CHECK_MEM_ALLOC(s);
    }

    memcpy(s, s1->s, s1->len);
    memcpy(s+s1->len, s2->s, s2->len);

    gravity_value_t v = VALUE_FROM_STRING(vm, s, len);
    if (s != NULL && s != buffer) mem_free(s);

    RETURN_VALUE(v, rindex);
}